

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

int check_ecdsa(u8 *Q,u8 *R,u8 *S,u8 *hash,int isSHA256)

{
  int iVar1;
  u8 local_138 [8];
  u8 r2 [60];
  u8 r1 [60];
  u8 w2 [30];
  u8 w1 [30];
  u8 e [30];
  u8 Sinv [30];
  int isSHA256_local;
  u8 *hash_local;
  u8 *S_local;
  u8 *R_local;
  u8 *Q_local;
  
  bn_inv(e + 0x18,S,ec_N,0x1e);
  elt_zero(w1 + 0x18);
  if (isSHA256 == 0) {
    e._2_6_ = (undefined6)*(undefined8 *)hash;
    e._8_2_ = (undefined2)((ulong)*(undefined8 *)hash >> 0x30);
    e._10_6_ = (undefined6)*(undefined8 *)(hash + 8);
    e._16_2_ = (undefined2)((ulong)*(undefined8 *)(hash + 8) >> 0x30);
    e._18_2_ = (undefined2)*(undefined4 *)(hash + 0x10);
    e._20_2_ = (undefined2)((uint)*(undefined4 *)(hash + 0x10) >> 0x10);
  }
  else {
    bn_shiftr(hash,0x20,7);
    unique0x00012000 = *(undefined8 *)hash;
    e._0_2_ = (undefined2)*(undefined8 *)(hash + 8);
    e._2_6_ = (undefined6)((ulong)*(undefined8 *)(hash + 8) >> 0x10);
    e._8_2_ = (undefined2)*(undefined8 *)(hash + 0x10);
    e._10_6_ = (undefined6)((ulong)*(undefined8 *)(hash + 0x10) >> 0x10);
    e._16_2_ = (undefined2)*(undefined4 *)(hash + 0x18);
    e._18_2_ = (undefined2)((uint)*(undefined4 *)(hash + 0x18) >> 0x10);
    e._20_2_ = *(undefined2 *)(hash + 0x1c);
  }
  bn_mul(w2 + 0x18,w1 + 0x18,e + 0x18,ec_N,0x1e);
  bn_mul(r1 + 0x38,R,e + 0x18,ec_N,0x1e);
  point_mul(r2 + 0x38,w2 + 0x18,ec_G);
  point_mul(local_138,r1 + 0x38,Q);
  point_add(r2 + 0x38,r2 + 0x38,local_138);
  iVar1 = bn_compare(r2 + 0x38,ec_N,0x1e);
  if (-1 < iVar1) {
    bn_sub_modulus(r2 + 0x38,ec_N,0x1e);
  }
  iVar1 = bn_compare(r2 + 0x38,R,0x1e);
  return (int)(iVar1 == 0);
}

Assistant:

int check_ecdsa(u8 *Q, u8 *R, u8 *S, u8 *hash, int isSHA256)
{
	u8 Sinv[30];
	u8 e[30];
	u8 w1[30], w2[30];
	u8 r1[60], r2[60];

	bn_inv(Sinv, S, ec_N, 30);

	elt_zero(e);

	if (isSHA256)
	{
		bn_shiftr(hash, 32, 7);  //shift right 7 bits.
		memcpy(e, hash, 30);     //then shift 16 more bits right by cutting off the last two bytes of 32 byte sha256.
    	                         //this gets our bignum sha256 hash to fit in the 233 bit limit of this ecdsa curve.
	}
	else
	{
		// Simon - New addition: added support for SHA1, very insecure as top 80 bits are always zeroes
		memcpy(e + 10, hash, 20);
	}

	bn_mul(w1, e, Sinv, ec_N, 30);
	bn_mul(w2, R, Sinv, ec_N, 30);

	point_mul(r1, w1, ec_G);
	point_mul(r2, w2, Q);

	point_add(r1, r1, r2);

	if (bn_compare(r1, ec_N, 30) >= 0)
		bn_sub_modulus(r1, ec_N, 30);

	return (bn_compare(r1, R, 30) == 0);
}